

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-graph.h
# Opt level: O2

Locations * __thiscall wasm::LazyLocalGraph::getLocations(LazyLocalGraph *this)

{
  if ((this->locations).
      super__Optional_base<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>_>
      ._M_engaged == false) {
    computeLocations(this);
    if ((this->locations).
        super__Optional_base<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>_>
        ._M_engaged == false) {
      __assert_fail("locations",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/local-graph.h"
                    ,0xe6,"const Locations &wasm::LazyLocalGraph::getLocations() const");
    }
  }
  return (Locations *)&this->locations;
}

Assistant:

const Locations& getLocations() const {
    if (!locations) {
      computeLocations();
      assert(locations);
    }
    return *locations;
  }